

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palobjbase.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CPalObjectBase::GetProcessLocalData
          (CPalObjectBase *this,CPalThread *pthr,LockType eLockRequest,IDataLock **ppDataLock,
          void **ppvProcessLocalData)

{
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","GetProcessLocalData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/palobjbase.cpp"
            ,0xca);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (WriteLock < eLockRequest) {
    fprintf(_stderr,"] %s %s:%d","GetProcessLocalData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/palobjbase.cpp"
            ,0xcb);
    fprintf(_stderr,"Expression: ReadLock == eLockRequest || WriteLock == eLockRequest\n");
  }
  if (ppDataLock == (IDataLock **)0x0) {
    fprintf(_stderr,"] %s %s:%d","GetProcessLocalData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/palobjbase.cpp"
            ,0xcc);
    fprintf(_stderr,"Expression: NULL != ppDataLock\n");
  }
  if (ppvProcessLocalData == (void **)0x0) {
    fprintf(_stderr,"] %s %s:%d","GetProcessLocalData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/palobjbase.cpp"
            ,0xcd);
    fprintf(_stderr,"Expression: NULL != ppvProcessLocalData\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    if (this->m_pot->m_dwProcessLocalDataSize == 0) {
      fprintf(_stderr,"] %s %s:%d","GetProcessLocalData",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/palobjbase.cpp"
              ,0xd9);
      fprintf(_stderr,"Expression: 0 < m_pot->GetProcessLocalDataSize()\n");
    }
    InternalEnterCriticalSection(pthr,&(this->m_sdlLocalData).m_cs);
    *ppDataLock = &(this->m_sdlLocalData).super_IDataLock;
    *ppvProcessLocalData = this->m_pvLocalData;
    if (PAL_InitializeChakraCoreCalled != false) {
      return 0;
    }
  }
  abort();
}

Assistant:

PAL_ERROR
CPalObjectBase::GetProcessLocalData(
    CPalThread *pthr,
    LockType eLockRequest,
    IDataLock **ppDataLock,             // OUT
    void **ppvProcessLocalData          // OUT
    )
{
    _ASSERTE(NULL != pthr);
    _ASSERTE(ReadLock == eLockRequest || WriteLock == eLockRequest);
    _ASSERTE(NULL != ppDataLock);
    _ASSERTE(NULL != ppvProcessLocalData);
    
    ENTRY("CPalObjectBase::GetProcessLocalData"
        "(this = %p, pthr = %p, eLockRequest = %d, ppDataLock = %p,"
        " ppvProcessLocalData = %p)\n",
        this,
        pthr,
        eLockRequest,
        ppDataLock,
        ppvProcessLocalData
        );
    
    _ASSERTE(0 < m_pot->GetProcessLocalDataSize());

    m_sdlLocalData.AcquireLock(pthr, ppDataLock);
    *ppvProcessLocalData = m_pvLocalData;

    LOGEXIT("CPalObjectBase::GetProcessLocalData returns %d\n", NO_ERROR);
    
    return NO_ERROR;
}